

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void usageMessage(ostream *stream,char *program_name,bool verbose)

{
  ostream *poVar1;
  byte in_DL;
  char *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"Usage: ");
  poVar1 = std::operator<<(poVar1,in_RSI);
  std::operator<<(poVar1," [options] imagefile [imagefile ...]\n");
  if ((in_DL & 1) != 0) {
    std::operator<<(in_RDI,
                    "\nRead exr files to validate their contents and the correct behavior of the software.\n\nOptions:\n  -m            avoid excessive memory allocation (some files will not be fully checked)\n  -t            avoid spending excessive time (some files will not be fully checked)\n  -s            use stream API instead of file API\n  -c            add core library checks\n  -h, --help    print this message\n      --version print version information\n\nReport bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
                   );
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name << " [options] imagefile [imagefile ...]\n";

    if (verbose)
        stream << "\n"
            "Read exr files to validate their contents and the correct behavior of the software.\n"
            "\n"
            "Options:\n"
            "  -m            avoid excessive memory allocation (some files will not be fully checked)\n"
            "  -t            avoid spending excessive time (some files will not be fully checked)\n"
            "  -s            use stream API instead of file API\n"
            "  -c            add core library checks\n"
            "  -h, --help    print this message\n"
            "      --version print version information\n"
            "\n"
            "Report bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
            "";
}